

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  Handle proc_00;
  bool bVar1;
  ostream *poVar2;
  Handle proc;
  Module libc;
  allocator local_5d;
  Handle local_5c;
  string local_58;
  Module local_38;
  
  local_5c = remote::OpenProcess(0x150c);
  bVar1 = remote::Handle::IsRunning(&local_5c);
  proc_00.pid = local_5c.pid;
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_58,"libpthread-2.19.so",&local_5d);
    remote::GetModuleHandle(&local_38,proc_00,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    if (local_38.regions.super__Vector_base<remote::Region,_std::allocator<remote::Region>_>._M_impl
        .super__Vector_impl_data._M_finish !=
        local_38.regions.super__Vector_base<remote::Region,_std::allocator<remote::Region>_>._M_impl
        .super__Vector_impl_data._M_start) {
      poVar2 = std::operator<<((ostream *)&std::cout,"libc = ");
      *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
           *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    remote::Module::~Module(&local_38);
  }
  return 0;
}

Assistant:

int main() {

    remote::Handle proc = remote::OpenProcess(5388);

    if(proc.IsRunning()) {
        remote::Module libc = remote::GetModuleHandle(proc, "libpthread-2.19.so");

        if(libc.IsValid()) {
            // We need to grab symbol list
            cout << "libc = " << hex << libc.GetStart() << endl;
        }

        /*
        std::vector<remote::Region> rs = remote::GetRegions(proc.pid);

        for(size_t i = 0; i < rs.size(); i++) {
            if(!rs[i].filename.empty()) {
                std::cout << "Filename: " << rs[i].filename << std::endl;
            }

            if(!rs[i].pathname.empty()) {
                std::cout << "Path: " << rs[i].pathname << std::endl;
            }

            std::cout << "Start: " << std::hex << rs[i].start << std::endl;
            std::cout << "End: " << std::hex << rs[i].end << std::endl;
            std::cout << "Permissions: " << rs[i].read << rs[i].write << rs[i].exec << rs[i].shared << std::endl;
            std::cout << "Offset: " << std::hex << rs[i].offset << std::endl;
            std::cout << "Device: " << std::dec << rs[i].deviceMajor << ":" << rs[i].deviceMinor << std::endl;
            std::cout << "INode: " << std::dec << rs[i].inodeFileNumber << std::endl;
            std::cout << "-------------------------------------" << std::endl;
        }

        size_t calc_base = proc.GetModuleAddress("gnome-calculator");

        cout << "Calculator Base: " << hex << calc_base << endl;
        */
    }

    return 0;
}